

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O2

int aom_vector_var_avx2(int16_t *ref,int16_t *src,int bwl)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  uint uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  __m256i sse;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  if (3 < bwl - 2U) {
    return 0;
  }
  switch(bwl) {
  case 2:
    auVar9 = vpsubw_avx2(*(undefined1 (*) [32])ref,*(undefined1 (*) [32])src);
    auVar2 = vpmaddwd_avx2(auVar9,auVar9);
    auVar11._8_2_ = 1;
    auVar11._0_8_ = 0x1000100010001;
    auVar11._10_2_ = 1;
    auVar11._12_2_ = 1;
    auVar11._14_2_ = 1;
    auVar11._16_2_ = 1;
    auVar11._18_2_ = 1;
    auVar11._20_2_ = 1;
    auVar11._22_2_ = 1;
    auVar11._24_2_ = 1;
    auVar11._26_2_ = 1;
    auVar11._28_2_ = 1;
    auVar11._30_2_ = 1;
    auVar9 = vpmaddwd_avx2(auVar9,auVar11);
    auVar2 = vphaddd_avx2(auVar9,auVar2);
    auVar9 = vpsrldq_avx2(auVar2,4);
    auVar2 = vpaddd_avx2(auVar2,auVar9);
    auVar1 = vpaddd_avx(auVar2._16_16_,auVar2._0_16_);
    iVar5 = auVar1._8_4_;
    uVar6 = (uint)(auVar1._0_4_ * auVar1._0_4_) >> 4;
    break;
  case 3:
    auVar8 = vpsubw_avx2(*(undefined1 (*) [32])ref,*(undefined1 (*) [32])src);
    auVar3 = vpsubw_avx2(*(undefined1 (*) [32])(ref + 0x10),*(undefined1 (*) [32])(src + 0x10));
    auVar2 = vpmaddwd_avx2(auVar8,auVar8);
    auVar9 = vpmaddwd_avx2(auVar3,auVar3);
    auVar9 = vpaddd_avx2(auVar9,auVar2);
    auVar2 = vpaddw_avx2(auVar3,auVar8);
    auVar10._8_2_ = 1;
    auVar10._0_8_ = 0x1000100010001;
    auVar10._10_2_ = 1;
    auVar10._12_2_ = 1;
    auVar10._14_2_ = 1;
    auVar10._16_2_ = 1;
    auVar10._18_2_ = 1;
    auVar10._20_2_ = 1;
    auVar10._22_2_ = 1;
    auVar10._24_2_ = 1;
    auVar10._26_2_ = 1;
    auVar10._28_2_ = 1;
    auVar10._30_2_ = 1;
    auVar2 = vpmaddwd_avx2(auVar2,auVar10);
    auVar2 = vphaddd_avx2(auVar2,auVar9);
    auVar9 = vpsrldq_avx2(auVar2,4);
    auVar2 = vpaddd_avx2(auVar2,auVar9);
    auVar1 = vpaddd_avx(auVar2._16_16_,auVar2._0_16_);
    iVar5 = auVar1._8_4_;
    uVar6 = (uint)(auVar1._0_4_ * auVar1._0_4_) >> 5;
    break;
  case 4:
    local_80 = 0;
    lStack_78 = 0;
    lStack_70 = 0;
    lStack_68 = 0;
    local_a0 = 0;
    lStack_98 = 0;
    lStack_90 = 0;
    lStack_88 = 0;
    calc_vector_mean_sse_64wd(src,ref,(__m256i *)&local_80,(__m256i *)&local_a0);
    auVar7._8_2_ = 1;
    auVar7._0_8_ = 0x1000100010001;
    auVar7._10_2_ = 1;
    auVar7._12_2_ = 1;
    auVar7._14_2_ = 1;
    auVar7._16_2_ = 1;
    auVar7._18_2_ = 1;
    auVar7._20_2_ = 1;
    auVar7._22_2_ = 1;
    auVar7._24_2_ = 1;
    auVar7._26_2_ = 1;
    auVar7._28_2_ = 1;
    auVar7._30_2_ = 1;
    auVar4._8_8_ = lStack_78;
    auVar4._0_8_ = local_80;
    auVar4._16_8_ = lStack_70;
    auVar4._24_8_ = lStack_68;
    auVar2 = vpmaddwd_avx2(auVar7,auVar4);
    auVar3._8_8_ = lStack_98;
    auVar3._0_8_ = local_a0;
    auVar3._16_8_ = lStack_90;
    auVar3._24_8_ = lStack_88;
    auVar2 = vphaddd_avx2(auVar2,auVar3);
    auVar9 = vpsrldq_avx2(auVar2,4);
    auVar2 = vpaddd_avx2(auVar2,auVar9);
    auVar1 = vpaddd_avx(auVar2._16_16_,auVar2._0_16_);
    iVar5 = auVar1._8_4_;
    uVar6 = (uint)(auVar1._0_4_ * auVar1._0_4_) >> 6;
    break;
  case 5:
    local_80 = 0;
    lStack_78 = 0;
    lStack_70 = 0;
    lStack_68 = 0;
    local_a0 = 0;
    lStack_98 = 0;
    lStack_90 = 0;
    lStack_88 = 0;
    calc_vector_mean_sse_64wd(src,ref,(__m256i *)&local_80,(__m256i *)&local_a0);
    calc_vector_mean_sse_64wd(src + 0x40,ref + 0x40,(__m256i *)&local_80,(__m256i *)&local_a0);
    auVar8._8_2_ = 1;
    auVar8._0_8_ = 0x1000100010001;
    auVar8._10_2_ = 1;
    auVar8._12_2_ = 1;
    auVar8._14_2_ = 1;
    auVar8._16_2_ = 1;
    auVar8._18_2_ = 1;
    auVar8._20_2_ = 1;
    auVar8._22_2_ = 1;
    auVar8._24_2_ = 1;
    auVar8._26_2_ = 1;
    auVar8._28_2_ = 1;
    auVar8._30_2_ = 1;
    auVar2._8_8_ = lStack_78;
    auVar2._0_8_ = local_80;
    auVar2._16_8_ = lStack_70;
    auVar2._24_8_ = lStack_68;
    auVar2 = vpmaddwd_avx2(auVar8,auVar2);
    auVar9._8_8_ = lStack_98;
    auVar9._0_8_ = local_a0;
    auVar9._16_8_ = lStack_90;
    auVar9._24_8_ = lStack_88;
    auVar2 = vphaddd_avx2(auVar2,auVar9);
    auVar9 = vpsrldq_avx2(auVar2,4);
    auVar2 = vpaddd_avx2(auVar2,auVar9);
    auVar1 = vpaddd_avx(auVar2._16_16_,auVar2._0_16_);
    iVar5 = auVar1._8_4_;
    uVar6 = (uint)(auVar1._0_4_ * auVar1._0_4_) >> 7;
  }
  return iVar5 - uVar6;
}

Assistant:

int aom_vector_var_avx2(const int16_t *ref, const int16_t *src, int bwl) {
  const int width = 4 << bwl;
  assert(width % 16 == 0 && width <= 128);
  int var = 0;

  // Instead of having a loop over width 16, considered loop unrolling to avoid
  // some addition operations.
  if (width == 128) {
    __m256i mean = _mm256_setzero_si256();
    __m256i sse = _mm256_setzero_si256();

    calc_vector_mean_sse_64wd(src, ref, &mean, &sse);
    calc_vector_mean_sse_64wd(src + 64, ref + 64, &mean, &sse);
    CALC_VAR_FROM_MEAN_SSE(mean, sse)
  } else if (width == 64) {
    __m256i mean = _mm256_setzero_si256();
    __m256i sse = _mm256_setzero_si256();

    calc_vector_mean_sse_64wd(src, ref, &mean, &sse);
    CALC_VAR_FROM_MEAN_SSE(mean, sse)
  } else if (width == 32) {
    const __m256i src_line0 = _mm256_loadu_si256((const __m256i *)src);
    const __m256i ref_line0 = _mm256_loadu_si256((const __m256i *)ref);
    const __m256i src_line1 = _mm256_loadu_si256((const __m256i *)(src + 16));
    const __m256i ref_line1 = _mm256_loadu_si256((const __m256i *)(ref + 16));

    const __m256i diff0 = _mm256_sub_epi16(ref_line0, src_line0);
    const __m256i diff1 = _mm256_sub_epi16(ref_line1, src_line1);
    const __m256i diff_sqr0 = _mm256_madd_epi16(diff0, diff0);
    const __m256i diff_sqr1 = _mm256_madd_epi16(diff1, diff1);
    const __m256i sse = _mm256_add_epi32(diff_sqr0, diff_sqr1);
    __m256i mean = _mm256_add_epi16(diff0, diff1);

    CALC_VAR_FROM_MEAN_SSE(mean, sse)
  } else if (width == 16) {
    const __m256i src_line = _mm256_loadu_si256((const __m256i *)src);
    const __m256i ref_line = _mm256_loadu_si256((const __m256i *)ref);
    __m256i mean = _mm256_sub_epi16(ref_line, src_line);
    const __m256i sse = _mm256_madd_epi16(mean, mean);

    CALC_VAR_FROM_MEAN_SSE(mean, sse)
  }
  return var;
}